

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O3

int Bmcs_ManPerform_Solve
              (Bmcs_Man_t *p,int iLit,pthread_t *WorkerThread,Par_ThData_t *ThData,int nProcs,
              int *pSolver)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int *piVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  long lVar9;
  
  uVar2 = (ulong)(uint)nProcs;
  if (nProcs < 1) {
LAB_00579888:
    iVar7 = -1;
    if (nProcs != 0) goto LAB_005798d8;
  }
  else {
    lVar3 = 0;
    do {
      *(int *)((long)&ThData->iLit + lVar3) = iLit;
      auVar1 = _DAT_0093d220;
      if (*(int *)((long)&ThData->fWorking + lVar3) != 0) {
        __assert_fail("ThData[i].fWorking == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                      ,0x306,
                      "int Bmcs_ManPerform_Solve(Bmcs_Man_t *, int, pthread_t *, Par_ThData_t *, int, int *)"
                     );
      }
      lVar3 = lVar3 + 0x18;
    } while (uVar2 * 0x18 != lVar3);
    if (nProcs < 1) goto LAB_00579888;
    lVar3 = uVar2 - 1;
    auVar6._8_4_ = (int)lVar3;
    auVar6._0_8_ = lVar3;
    auVar6._12_4_ = (int)((ulong)lVar3 >> 0x20);
    lVar3 = 0;
    auVar6 = auVar6 ^ _DAT_0093d220;
    auVar8 = _DAT_0093e4e0;
    auVar10 = _DAT_0093d210;
    do {
      auVar11 = auVar10 ^ auVar1;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar7 && auVar6._0_4_ < auVar11._0_4_ || iVar7 < auVar11._4_4_)
                & 1)) {
        *(undefined4 *)((long)&ThData->fWorking + lVar3) = 1;
      }
      if ((auVar11._12_4_ != auVar6._12_4_ || auVar11._8_4_ <= auVar6._8_4_) &&
          auVar11._12_4_ <= auVar6._12_4_) {
        *(undefined4 *)((long)&ThData[1].fWorking + lVar3) = 1;
      }
      auVar11 = auVar8 ^ auVar1;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar7 && (iVar12 != iVar7 || auVar11._0_4_ <= auVar6._0_4_)) {
        *(undefined4 *)((long)&ThData[2].fWorking + lVar3) = 1;
        *(undefined4 *)((long)&ThData[3].fWorking + lVar3) = 1;
      }
      lVar9 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar9 + 4;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar9 + 4;
      lVar3 = lVar3 + 0x60;
    } while ((ulong)(nProcs + 3U >> 2) * 0x60 != lVar3);
  }
  iVar7 = -1;
  do {
    if (nProcs < 1) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      piVar5 = &ThData->status;
      do {
        if (piVar5[-1] == 0) {
          p->fStopNow = 1;
          iVar7 = *piVar5;
          *pSolver = (int)uVar4;
          goto LAB_005798d3;
        }
        uVar4 = uVar4 + 1;
        piVar5 = piVar5 + 6;
      } while (uVar2 != uVar4);
      uVar4 = (ulong)(uint)nProcs;
    }
LAB_005798d3:
  } while ((int)uVar4 == nProcs);
LAB_005798d8:
  if (0 < nProcs) {
    lVar3 = 0;
    do {
      *(undefined4 *)((long)&ThData->iLit + lVar3) = 0xffffffff;
      if (*(int *)((long)&ThData->fWorking + lVar3) != 0) {
        __assert_fail("ThData[i].fWorking == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                      ,0x325,
                      "int Bmcs_ManPerform_Solve(Bmcs_Man_t *, int, pthread_t *, Par_ThData_t *, int, int *)"
                     );
      }
      lVar3 = lVar3 + 0x18;
    } while (uVar2 * 0x18 != lVar3);
  }
  p->fStopNow = 0;
  return iVar7;
}

Assistant:

int Bmcs_ManPerform_Solve( Bmcs_Man_t * p, int iLit, pthread_t * WorkerThread, Par_ThData_t * ThData, int nProcs, int * pSolver )
{
    int i, status = -1;
    // set new problem
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].iLit = iLit;
        assert( ThData[i].fWorking == 0 );
    }
    // start solvers on a new problem
    for ( i = 0; i < nProcs; i++ )
        ThData[i].fWorking = 1;
    // check if any of the solvers finished
    while ( i == nProcs )
    {
        for ( i = 0; i < nProcs; i++ )
        {
            if ( ThData[i].fWorking )
                continue;
            // set stop request
            p->fStopNow = 1;
            // remember status
            status = ThData[i].status;
            //printf( "Solver %d returned status %d.\n", i, status );
            *pSolver = i;
            break;
        }
    }
    // wait till threads finish
    while ( i < nProcs )
    {
        for ( i = 0; i < nProcs; i++ )
            if ( ThData[i].fWorking )
                break;
    }
    for ( i = 0; i < nProcs; i++ )
    {
        ThData[i].iLit = -1;
        assert( ThData[i].fWorking == 0 );
    }
    // reset stop request
    p->fStopNow = 0;
    return status;
}